

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O2

int resolve_base_ident(lys_module *module,lys_ident *ident,char *basename,char *parent,
                      lys_type *type,unres_schema *unres)

{
  uint *puVar1;
  byte bVar2;
  ushort uVar3;
  ly_ctx *plVar4;
  lys_ident *plVar5;
  lys_submodule *plVar6;
  long lVar7;
  int iVar8;
  lys_type_bit *plVar9;
  lys_tpdf *plVar10;
  lys_module *plVar11;
  ulong uVar12;
  long lVar13;
  char *pcVar14;
  uint uVar15;
  char **ppcVar16;
  int iVar17;
  uint8_t *puVar18;
  lys_ident *plVar19;
  char *local_a0;
  lys_ident *target;
  lys_module *local_90;
  lys_type *local_88;
  ulong local_80;
  ly_ctx *local_78;
  ulong local_70;
  ly_ctx *local_68;
  char *local_60;
  lys_ident *local_58;
  char *local_50;
  char **local_48;
  uint16_t local_3a;
  lys_module *local_38;
  
  if ((ident == (lys_ident *)0x0) != (type != (lys_type *)0x0)) {
    __assert_fail("(ident && !type) || (!ident && type)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,0x166c,
                  "int resolve_base_ident(const struct lys_module *, struct lys_ident *, const char *, const char *, struct lys_type *, struct unres_schema *)"
                 );
  }
  plVar4 = module->ctx;
  target = (lys_ident *)unres;
  local_38 = module;
  if (type == (lys_type *)0x0) {
    ppcVar16 = &local_a0;
    plVar10 = (lys_tpdf *)ident;
  }
  else {
    uVar15 = (type->info).bits.count + 1;
    (type->info).bits.count = uVar15;
    plVar9 = (lys_type_bit *)ly_realloc((type->info).bits.bit,(ulong)uVar15 << 3);
    (type->info).bits.bit = plVar9;
    if (plVar9 == (lys_type_bit *)0x0) {
      ly_log(plVar4,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","resolve_base_ident");
      return -1;
    }
    ppcVar16 = &plVar9->name + ((type->info).bits.count - 1);
    plVar10 = type->parent;
  }
  local_90 = plVar10->module;
  local_3a = plVar10->flags;
  local_88 = type;
  local_68 = plVar4;
  local_60 = parent;
  *ppcVar16 = (char *)0x0;
  local_50 = strchr(basename,0x3a);
  local_58 = ident;
  if (local_50 == (char *)0x0) {
    iVar17 = 0;
    pcVar14 = (char *)0x0;
    local_50 = basename;
  }
  else {
    iVar17 = (int)local_50 - (int)basename;
    local_50 = local_50 + 1;
    pcVar14 = local_38->name;
    iVar8 = strncmp(basename,pcVar14,(long)iVar17);
    if ((iVar8 == 0) && (pcVar14[iVar17] == '\0')) {
      iVar17 = 0;
      pcVar14 = (char *)0x0;
    }
    else {
      pcVar14 = (char *)0x0;
      if (iVar17 != 0) {
        pcVar14 = basename;
      }
    }
  }
  plVar19 = local_58;
  plVar11 = lyp_get_module(local_38,(char *)0x0,0,pcVar14,iVar17,0);
  if (plVar11 == (lys_module *)0x0) {
    ly_vlog(local_68,LYE_INMOD,LY_VLOG_NONE,(void *)0x0,basename);
    return -1;
  }
  local_78 = plVar11->ctx;
  uVar3 = plVar11->ident_size;
  lVar7 = -0x48;
  local_48 = ppcVar16;
  local_38 = (lys_module *)basename;
  do {
    lVar13 = lVar7;
    if ((ulong)uVar3 * 0x48 - (lVar13 + 0x48) == 0) {
      local_70 = (ulong)plVar11->inc_size;
      uVar12 = 0;
      while ((uVar12 != local_70 &&
             (plVar6 = plVar11->inc[uVar12].submodule, plVar6 != (lys_submodule *)0x0))) {
        uVar3 = plVar6->ident_size;
        lVar7 = -0x48;
        local_80 = uVar12;
        while (lVar13 = lVar7, (ulong)uVar3 * 0x48 - (lVar13 + 0x48) != 0) {
          plVar19 = plVar6->ident;
          iVar17 = strcmp(local_50,*(char **)(plVar19[1].padding + lVar13 + -0x1c));
          lVar7 = lVar13 + 0x48;
          if (iVar17 == 0) {
            puVar18 = plVar19[1].padding + lVar13 + -0x1c;
            plVar19 = local_58;
            goto LAB_0011cf09;
          }
        }
        uVar12 = local_80 + 1;
      }
      goto LAB_0011cfea;
    }
    plVar5 = plVar11->ident;
    iVar17 = strcmp(local_50,*(char **)(plVar5[1].padding + lVar13 + -0x1c));
    lVar7 = lVar13 + 0x48;
  } while (iVar17 != 0);
  puVar18 = plVar5[1].padding + lVar13 + -0x1c;
LAB_0011cf09:
  ppcVar16 = local_48;
  pcVar14 = local_50;
  plVar4 = local_78;
  if (plVar19 == (lys_ident *)0x0) {
    *local_48 = (char *)puVar18;
  }
  else {
    for (uVar12 = 0; *(uint *)&target->ext != uVar12; uVar12 = uVar12 + 1) {
      if (((uint8_t *)*(undefined8 **)(target->name + uVar12 * 8) == puVar18) &&
         (*(int *)(target->dsc + uVar12 * 4) == 0x100)) {
        if (*(char **)(target->ref + uVar12 * 8) == plVar19->name) {
          ly_vlog(local_78,LYE_INARG,LY_VLOG_NONE,(void *)0x0,local_50,"base");
          ly_vlog(plVar4,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Circular reference of \"%s\" identity.",
                  pcVar14);
          return -1;
        }
LAB_0011cfea:
        ly_vlog(local_68,LYE_INRESOLV,LY_VLOG_NONE,(void *)0x0,local_60,local_38);
        if (local_88 != (lys_type *)0x0) {
          puVar1 = &(local_88->info).bits.count;
          *puVar1 = *puVar1 - 1;
          return 1;
        }
        return 1;
      }
    }
    *local_48 = (char *)puVar18;
    if (plVar19 != (lys_ident *)0x0) {
      pcVar14 = plVar19->name;
      goto LAB_0011cf5f;
    }
  }
  pcVar14 = "of type";
LAB_0011cf5f:
  plVar11 = local_90;
  iVar8 = lyp_check_status(local_3a,local_90,pcVar14,*(uint16_t *)(puVar18 + 0x18),
                           *(lys_module **)(puVar18 + 0x30),*(char **)puVar18,(lys_node *)0x0);
  iVar17 = -(uint)(iVar8 != 0);
  if ((plVar19 != (lys_ident *)0x0) && (iVar8 == 0)) {
    plVar5 = (lys_ident *)*ppcVar16;
    bVar2 = plVar19->base_size;
    plVar19->base_size = bVar2 + 1;
    plVar19->base[bVar2] = plVar5;
    plVar11 = lys_main_module(plVar11);
    iVar17 = 0;
    if ((plVar11->field_0x40 & 0x80) != 0) {
      resolve_identity_backlink_update(plVar19,(lys_ident *)*ppcVar16);
    }
  }
  return iVar17;
}

Assistant:

static int
resolve_base_ident(const struct lys_module *module, struct lys_ident *ident, const char *basename, const char *parent,
                   struct lys_type *type, struct unres_schema *unres)
{
    const char *name;
    int mod_name_len = 0, rc;
    struct lys_ident *target, **ret;
    uint16_t flags;
    struct lys_module *mod;
    struct ly_ctx *ctx = module->ctx;

    assert((ident && !type) || (!ident && type));

    if (!type) {
        /* have ident to resolve */
        ret = &target;
        flags = ident->flags;
        mod = ident->module;
    } else {
        /* have type to fill */
        ++type->info.ident.count;
        type->info.ident.ref = ly_realloc(type->info.ident.ref, type->info.ident.count * sizeof *type->info.ident.ref);
        LY_CHECK_ERR_RETURN(!type->info.ident.ref, LOGMEM(ctx), -1);

        ret = &type->info.ident.ref[type->info.ident.count - 1];
        flags = type->parent->flags;
        mod = type->parent->module;
    }
    *ret = NULL;

    /* search for the base identity */
    name = strchr(basename, ':');
    if (name) {
        /* set name to correct position after colon */
        mod_name_len = name - basename;
        name++;

        if (!strncmp(basename, module->name, mod_name_len) && !module->name[mod_name_len]) {
            /* prefix refers to the current module, ignore it */
            mod_name_len = 0;
        }
    } else {
        name = basename;
    }

    /* get module where to search */
    module = lyp_get_module(module, NULL, 0, mod_name_len ? basename : NULL, mod_name_len, 0);
    if (!module) {
        /* identity refers unknown data model */
        LOGVAL(ctx, LYE_INMOD, LY_VLOG_NONE, NULL, basename);
        return -1;
    }

    /* search in the identified module ... */
    rc = resolve_base_ident_sub(module, ident, name, unres, ret);
    if (!rc) {
        assert(*ret);

        /* check status */
        if (lyp_check_status(flags, mod, ident ? ident->name : "of type",
                             (*ret)->flags, (*ret)->module, (*ret)->name, NULL)) {
            rc = -1;
        } else if (ident) {
            ident->base[ident->base_size++] = *ret;
            if (lys_main_module(mod)->implemented) {
                /* in case of the implemented identity, maintain backlinks to it
                 * from the base identities to make it available when resolving
                 * data with the identity values (not implemented identity is not
                 * allowed as an identityref value). */
                resolve_identity_backlink_update(ident, *ret);
            }
        }
    } else if (rc == EXIT_FAILURE) {
        LOGVAL(ctx, LYE_INRESOLV, LY_VLOG_NONE, NULL, parent, basename);
        if (type) {
            --type->info.ident.count;
        }
    }

    return rc;
}